

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffimem(fitsfile **fptr,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  int iVar1;
  void *pvVar2;
  size_t in_RCX;
  size_t *in_RDX;
  void **in_RSI;
  long *in_RDI;
  _func_void_ptr_void_ptr_size_t *in_R8;
  fitsfile *in_R9;
  int handle;
  char urltype [20];
  int slen;
  int driver;
  int ii;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffc0;
  int iVar3;
  int local_4;
  
  if (in_R9->HDUposition < 1) {
    *in_RDI = 0;
    if (need_to_initialize != 0) {
      iVar1 = fits_init_cfitsio();
      in_R9->HDUposition = iVar1;
    }
    if (in_R9->HDUposition < 1) {
      strcpy(&stack0xffffffffffffffa8,"memkeep://");
      iVar1 = urltype2driver(in_stack_ffffffffffffffa8,
                             (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      in_R9->HDUposition = iVar1;
      if (in_R9->HDUposition < 1) {
        iVar1 = mem_openmem(in_RSI,in_RDX,in_RCX,in_R8,(int *)&stack0xffffffffffffffa4);
        in_R9->HDUposition = iVar1;
        if (in_R9->HDUposition < 1) {
          pvVar2 = calloc(1,0x10);
          *in_RDI = (long)pvVar2;
          if (*in_RDI == 0) {
            (*driverTable[in_stack_ffffffffffffffc0].close)(in_stack_ffffffffffffffa4);
            ffpmsg((char *)0x11f046);
            in_R9->HDUposition = 0x71;
            local_4 = 0x71;
          }
          else {
            pvVar2 = calloc(1,0x7e8);
            *(void **)(*in_RDI + 8) = pvVar2;
            if (*(long *)(*in_RDI + 8) == 0) {
              (*driverTable[in_stack_ffffffffffffffc0].close)(in_stack_ffffffffffffffa4);
              ffpmsg((char *)0x11f0b7);
              free((void *)*in_RDI);
              *in_RDI = 0;
              in_R9->HDUposition = 0x71;
              local_4 = 0x71;
            }
            else {
              iVar1 = 0x20;
              pvVar2 = malloc(0x20);
              *(void **)(*(long *)(*in_RDI + 8) + 0x10) = pvVar2;
              if (*(long *)(*(long *)(*in_RDI + 8) + 0x10) == 0) {
                (*driverTable[in_stack_ffffffffffffffc0].close)(in_stack_ffffffffffffffa4);
                ffpmsg((char *)0x11f14c);
                free(*(void **)(*in_RDI + 8));
                free((void *)*in_RDI);
                *in_RDI = 0;
                in_R9->HDUposition = 0x71;
                local_4 = 0x71;
              }
              else {
                pvVar2 = calloc(0x3e9,8);
                *(void **)(*(long *)(*in_RDI + 8) + 0x68) = pvVar2;
                if (*(long *)(*(long *)(*in_RDI + 8) + 0x68) == 0) {
                  (*driverTable[in_stack_ffffffffffffffc0].close)(in_stack_ffffffffffffffa4);
                  ffpmsg((char *)0x11f1f3);
                  free(*(void **)(*(long *)(*in_RDI + 8) + 0x10));
                  free(*(void **)(*in_RDI + 8));
                  free((void *)*in_RDI);
                  *in_RDI = 0;
                  in_R9->HDUposition = 0x71;
                  local_4 = 0x71;
                }
                else {
                  pvVar2 = calloc(0x28,0xb40);
                  *(void **)(*(long *)(*in_RDI + 8) + 0x560) = pvVar2;
                  if (*(long *)(*(long *)(*in_RDI + 8) + 0x560) == 0) {
                    (*driverTable[in_stack_ffffffffffffffc0].close)(in_stack_ffffffffffffffa4);
                    ffpmsg((char *)0x11f2b5);
                    free(*(void **)(*(long *)(*in_RDI + 8) + 0x68));
                    free(*(void **)(*(long *)(*in_RDI + 8) + 0x10));
                    free(*(void **)(*in_RDI + 8));
                    free((void *)*in_RDI);
                    *in_RDI = 0;
                    in_R9->HDUposition = 0x71;
                    local_4 = 0x71;
                  }
                  else {
                    for (iVar3 = 0; iVar3 < 0x28; iVar3 = iVar3 + 1) {
                      *(int *)(*(long *)(*in_RDI + 8) + 0x748 + (long)iVar3 * 4) = iVar3;
                      *(undefined8 *)(*(long *)(*in_RDI + 8) + 0x568 + (long)iVar3 * 8) =
                           0xffffffffffffffff;
                    }
                    *(undefined4 *)(*(long *)(*in_RDI + 8) + 100) = 1000;
                    **(int **)(*in_RDI + 8) = in_stack_ffffffffffffffa4;
                    *(int *)(*(long *)(*in_RDI + 8) + 4) = in_stack_ffffffffffffffc0;
                    strcpy(*(char **)(*(long *)(*in_RDI + 8) + 0x10),"memfile");
                    *(size_t *)(*(long *)(*in_RDI + 8) + 0x28) = *in_RDX;
                    *(size_t *)(*(long *)(*in_RDI + 8) + 0x30) = *in_RDX;
                    *(undefined4 *)(*(long *)(*in_RDI + 8) + 0x5c) = 1;
                    *(undefined8 *)(*(long *)(*in_RDI + 8) + 0x88) = 0xffffffffffffffff;
                    *(undefined4 *)(*(long *)(*in_RDI + 8) + 0x50) = 0xffffffff;
                    *(undefined4 *)(*(long *)(*in_RDI + 8) + 8) = 1;
                    *(undefined4 *)(*(long *)(*in_RDI + 8) + 0x18) = 0x22b;
                    *(undefined4 *)(*(long *)(*in_RDI + 8) + 0x20) = 0;
                    ffldrc(in_R9,CONCAT44(iVar3,in_stack_ffffffffffffffc0),iVar1,
                           in_stack_ffffffffffffffb0);
                    fits_store_Fptr(*(FITSfile **)(*in_RDI + 8),&in_R9->HDUposition);
                    local_4 = in_R9->HDUposition;
                  }
                }
              }
            }
          }
        }
        else {
          ffpmsg((char *)0x11efe5);
          local_4 = in_R9->HDUposition;
        }
      }
      else {
        ffpmsg((char *)0x11ef98);
        local_4 = in_R9->HDUposition;
      }
    }
    else {
      local_4 = in_R9->HDUposition;
    }
  }
  else {
    local_4 = in_R9->HDUposition;
  }
  return local_4;
}

Assistant:

int ffimem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */

/*
  Create and initialize a new FITS file in memory
*/
{
    int ii, driver, slen;
    char urltype[MAX_PREFIX_LEN];
    int handle;

    if (*status > 0)
        return(*status);

    *fptr = 0;              /* initialize null file pointer */

    if (need_to_initialize)    {        /* this is called only once */
       *status = fits_init_cfitsio();
    }
    
    if (*status > 0)
        return(*status);

    strcpy(urltype, "memkeep://"); /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffimem)");
        return(*status);
    }

    /* call driver routine to "open" the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize, deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffimem)");
         return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for memory file: (ffimem)");
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = 32; /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffimem)");
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffimem)");
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffimem)");
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, "memfile"); /* dummy filename */
    ((*fptr)->Fptr)->filesize = *buffsize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = *buffsize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = 1;               /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED;  /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */
    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */
    return(*status); 
}